

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xts_test.cc
# Opt level: O3

void __thiscall XTSTest_TestVectors_Test::TestBody(XTSTest_TestVectors_Test *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  EVP_CIPHER *cipher;
  size_type __n;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var4;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  pointer pcVar5;
  char *in_R9;
  long lVar6;
  ScopedTrace gtest_trace_215;
  ScopedTrace gtest_trace_231;
  bool in_place;
  vector<unsigned_char,_std::allocator<unsigned_char>_> out;
  int len;
  vector<unsigned_char,_std::allocator<unsigned_char>_> plaintext;
  uint test_num;
  vector<unsigned_char,_std::allocator<unsigned_char>_> ciphertext;
  vector<unsigned_char,_std::allocator<unsigned_char>_> iv;
  vector<unsigned_char,_std::allocator<unsigned_char>_> key;
  ScopedEVP_CIPHER_CTX ctx;
  ScopedTrace local_1bb;
  ScopedTrace local_1ba;
  bool local_1b9;
  undefined1 local_1b8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1b0;
  undefined1 local_1a8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_188;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *local_180;
  long local_178;
  Bytes local_170;
  AssertHelper local_160;
  int local_158;
  char local_152 [2];
  long local_150;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_148;
  uint local_12c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_128;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_108;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_e8;
  undefined1 local_c8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8 [8];
  
  local_12c = 0;
  local_150 = 0;
  do {
    local_12c = local_12c + 1;
    testing::ScopedTrace::ScopedTrace<unsigned_int>
              (&local_1bb,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/xts/xts_test.cc"
               ,0xd7,&local_12c);
    cipher = EVP_aes_256_xts();
    local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (uchar *)0x0;
    local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (uchar *)0x0;
    local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_128.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_128.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_128.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_c8,*(char **)((long)&kXTSTestCases[0].key_hex + local_150),
               (allocator<char> *)&local_188);
    bVar1 = DecodeHex(&local_e8,(string *)local_c8);
    local_1a8[0] = (internal)bVar1;
    local_1a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_c8._1_7_,local_c8[0]) == local_b8) {
      if (bVar1) goto LAB_001251e7;
LAB_00125b9c:
      testing::Message::Message((Message *)&local_188);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_c8,(internal *)local_1a8,
                 (AssertionResult *)"DecodeHex(&key, test.key_hex)","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_1b8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/xts/xts_test.cc"
                 ,0xdc,(char *)CONCAT71(local_c8._1_7_,local_c8[0]));
      testing::internal::AssertHelper::operator=((AssertHelper *)local_1b8,(Message *)&local_188);
LAB_00125d34:
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_c8._1_7_,local_c8[0]) != local_b8) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_c8._1_7_,local_c8[0]),
                        local_b8[0]._M_allocated_capacity + 1);
      }
      if (local_188._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_188._M_head_impl + 8))();
      }
      if (local_1a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      goto LAB_00125ea2;
      this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_1a0;
      local_c0 = local_1a0;
LAB_00125e9d:
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()(this_00,local_c0);
LAB_00125ea2:
      if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
          local_128.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        operator_delete(local_128.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_128.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_128.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
          local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        operator_delete(local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_148.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_148.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (uchar *)0x0) {
        operator_delete(local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_108.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_108.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (uchar *)0x0) {
        operator_delete(local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_e8.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_e8.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      testing::ScopedTrace::~ScopedTrace(&local_1bb);
      return;
    }
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_c8._1_7_,local_c8[0]),local_b8[0]._M_allocated_capacity + 1);
    if (((ulong)local_1a8 & 1) == 0) goto LAB_00125b9c;
LAB_001251e7:
    if (local_1a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_1a0,local_1a0);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_c8,*(char **)((long)&kXTSTestCases[0].iv_hex + local_150),
               (allocator<char> *)&local_188);
    bVar1 = DecodeHex(&local_108,(string *)local_c8);
    local_1a8[0] = (internal)bVar1;
    local_1a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_c8._1_7_,local_c8[0]) == local_b8) {
      if (!bVar1) goto LAB_00125c04;
    }
    else {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_c8._1_7_,local_c8[0]),local_b8[0]._M_allocated_capacity + 1)
      ;
      if (((ulong)local_1a8 & 1) == 0) {
LAB_00125c04:
        testing::Message::Message((Message *)&local_188);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_c8,(internal *)local_1a8,
                   (AssertionResult *)"DecodeHex(&iv, test.iv_hex)","false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_1b8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/xts/xts_test.cc"
                   ,0xdd,(char *)CONCAT71(local_c8._1_7_,local_c8[0]));
        testing::internal::AssertHelper::operator=((AssertHelper *)local_1b8,(Message *)&local_188);
        goto LAB_00125d34;
      }
    }
    if (local_1a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_1a0,local_1a0);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_c8,*(char **)((long)&kXTSTestCases[0].plaintext_hex + local_150),
               (allocator<char> *)&local_188);
    bVar1 = DecodeHex(&local_148,(string *)local_c8);
    local_1a8[0] = (internal)bVar1;
    local_1a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_c8._1_7_,local_c8[0]) == local_b8) {
      if (!bVar1) goto LAB_00125c6c;
    }
    else {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_c8._1_7_,local_c8[0]),local_b8[0]._M_allocated_capacity + 1)
      ;
      if (((ulong)local_1a8 & 1) == 0) {
LAB_00125c6c:
        testing::Message::Message((Message *)&local_188);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_c8,(internal *)local_1a8,
                   (AssertionResult *)"DecodeHex(&plaintext, test.plaintext_hex)","false","true",
                   in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_1b8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/xts/xts_test.cc"
                   ,0xde,(char *)CONCAT71(local_c8._1_7_,local_c8[0]));
        testing::internal::AssertHelper::operator=((AssertHelper *)local_1b8,(Message *)&local_188);
        goto LAB_00125d34;
      }
    }
    if (local_1a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_1a0,local_1a0);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_c8,*(char **)((long)&kXTSTestCases[0].ciphertext_hex + local_150),
               (allocator<char> *)&local_188);
    bVar1 = DecodeHex(&local_128,(string *)local_c8);
    local_1a8[0] = (internal)bVar1;
    local_1a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_c8._1_7_,local_c8[0]) == local_b8) {
      if (!bVar1) goto LAB_00125cd1;
    }
    else {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_c8._1_7_,local_c8[0]),local_b8[0]._M_allocated_capacity + 1)
      ;
      if (((ulong)local_1a8 & 1) == 0) {
LAB_00125cd1:
        testing::Message::Message((Message *)&local_188);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_c8,(internal *)local_1a8,
                   (AssertionResult *)"DecodeHex(&ciphertext, test.ciphertext_hex)","false","true",
                   in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_1b8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/xts/xts_test.cc"
                   ,0xdf,(char *)CONCAT71(local_c8._1_7_,local_c8[0]));
        testing::internal::AssertHelper::operator=((AssertHelper *)local_1b8,(Message *)&local_188);
        goto LAB_00125d34;
      }
    }
    if (local_1a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_1a0,local_1a0);
    }
    iVar2 = EVP_CIPHER_key_length(cipher);
    local_188._M_head_impl._0_4_ = iVar2;
    local_1a8 = (undefined1  [8])
                (local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish +
                -(long)local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start);
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
              ((internal *)local_c8,"EVP_CIPHER_key_length(cipher)","key.size()",(uint *)&local_188,
               (unsigned_long *)local_1a8);
    if (local_c8[0] == '\0') {
      testing::Message::Message((Message *)local_1a8);
      if (local_c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = (local_c0->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_188,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/xts/xts_test.cc"
                 ,0xe1,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_188,(Message *)local_1a8);
LAB_00125e6e:
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_188);
      if (local_1a8 != (undefined1  [8])0x0) {
        (**(code **)(*(size_type *)local_1a8 + 8))();
      }
      if (local_c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      goto LAB_00125ea2;
      this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_c0;
      goto LAB_00125e9d;
    }
    if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_c0,local_c0);
    }
    iVar2 = EVP_CIPHER_iv_length(cipher);
    local_188._M_head_impl._0_4_ = iVar2;
    local_1a8 = (undefined1  [8])
                (local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_finish +
                -(long)local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start);
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
              ((internal *)local_c8,"EVP_CIPHER_iv_length(cipher)","iv.size()",(uint *)&local_188,
               (unsigned_long *)local_1a8);
    if (local_c8[0] == '\0') {
      testing::Message::Message((Message *)local_1a8);
      if (local_c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = (local_c0->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_188,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/xts/xts_test.cc"
                 ,0xe2,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_188,(Message *)local_1a8);
      goto LAB_00125e6e;
    }
    if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_c0,local_c0);
    }
    local_1a8 = (undefined1  [8])
                (local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_finish +
                -(long)local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start);
    local_188._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (local_128.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish +
         -(long)local_128.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start);
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)local_c8,"plaintext.size()","ciphertext.size()",
               (unsigned_long *)local_1a8,(unsigned_long *)&local_188);
    if (local_c8[0] == '\0') {
      testing::Message::Message((Message *)local_1a8);
      if (local_c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = (local_c0->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_188,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/xts/xts_test.cc"
                 ,0xe3,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_188,(Message *)local_1a8);
      goto LAB_00125e6e;
    }
    if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_c0,local_c0);
    }
    local_152[0] = '\0';
    local_152[1] = '\x01';
    lVar6 = 0;
    do {
      local_1b9 = (bool)local_152[lVar6];
      testing::ScopedTrace::ScopedTrace<bool>
                (&local_1ba,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/xts/xts_test.cc"
                 ,0xe7,&local_1b9);
      _Var4._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
      __n = (long)local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_188,__n,
                 (allocator_type *)local_c8);
      if (local_1b9 == true) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_188,&local_148);
        __n = (long)local_180 - (long)local_188._M_head_impl;
        _Var4._M_head_impl = local_188._M_head_impl;
      }
      EVP_CIPHER_CTX_init((EVP_CIPHER_CTX *)local_c8);
      iVar2 = EVP_EncryptInit_ex((EVP_CIPHER_CTX *)local_c8,cipher,(ENGINE *)0x0,
                                 local_e8.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start,
                                 local_108.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start);
      local_1b8[0] = iVar2 != 0;
      local_1b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (iVar2 == 0) {
        testing::Message::Message((Message *)&local_170);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_1a8,(internal *)local_1b8,
                   (AssertionResult *)
                   "EVP_EncryptInit_ex(ctx.get(), cipher, nullptr, key.data(), iv.data())","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_160,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/xts/xts_test.cc"
                   ,0xf3,(char *)local_1a8);
        testing::internal::AssertHelper::operator=(&local_160,(Message *)&local_170);
        testing::internal::AssertHelper::~AssertHelper(&local_160);
        if (local_1a8 != (undefined1  [8])&local_198) {
          operator_delete((void *)local_1a8,local_198._M_allocated_capacity + 1);
        }
        if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
            local_170.span_.data_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_170.span_.data_ + 8))();
        }
        if (local_1b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_1b0,local_1b0);
        }
        EVP_CIPHER_CTX_cleanup((EVP_CIPHER_CTX *)local_c8);
LAB_00125ad6:
        if (local_188._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          operator_delete(local_188._M_head_impl,local_178 - (long)local_188._M_head_impl);
        }
        testing::ScopedTrace::~ScopedTrace(&local_1ba);
        bVar1 = true;
        goto LAB_00125afa;
      }
      iVar2 = EVP_EncryptUpdate((EVP_CIPHER_CTX *)local_c8,(uchar *)local_188._M_head_impl,
                                &local_158,(uchar *)_Var4._M_head_impl,(int)__n);
      local_1b8[0] = iVar2 != 0;
      local_1b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (iVar2 == 0) {
        testing::Message::Message((Message *)&local_170);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_1a8,(internal *)local_1b8,
                   (AssertionResult *)
                   "EVP_EncryptUpdate(ctx.get(), out.data(), &len, in.data(), in.size())","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_160,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/xts/xts_test.cc"
                   ,0xf6,(char *)local_1a8);
        testing::internal::AssertHelper::operator=(&local_160,(Message *)&local_170);
LAB_00125a86:
        testing::internal::AssertHelper::~AssertHelper(&local_160);
        if (local_1a8 != (undefined1  [8])&local_198) {
          operator_delete((void *)local_1a8,local_198._M_allocated_capacity + 1);
        }
        if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
            local_170.span_.data_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_170.span_.data_ + 8))();
        }
        if (local_1b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_1b0,local_1b0);
        }
        EVP_CIPHER_CTX_cleanup((EVP_CIPHER_CTX *)local_c8);
        goto LAB_00125ad6;
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_188,(long)local_158
                );
      local_1b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  ((long)local_128.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_128.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      local_1b8 = (undefined1  [8])
                  local_128.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      local_170.span_.size_ = (long)local_180 - (long)local_188._M_head_impl;
      local_170.span_.data_ = (uchar *)local_188._M_head_impl;
      testing::internal::CmpHelperEQ<Bytes,Bytes>
                ((internal *)local_1a8,"Bytes(ciphertext)","Bytes(out)",(Bytes *)local_1b8,
                 &local_170);
      if (local_1a8[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_1b8);
        pcVar5 = "";
        if (local_1a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = (local_1a0->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_170,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/xts/xts_test.cc"
                   ,0xf8,pcVar5);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_170,(Message *)local_1b8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_170);
        if (local_1b8 != (undefined1  [8])0x0) {
          (**(code **)(*(long *)local_1b8 + 8))();
        }
      }
      if (local_1a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_1a0,local_1a0);
      }
      _Var4._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           local_128.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
      iVar2 = (int)local_128.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
      if (local_180 != local_188._M_head_impl) {
        local_180 = local_188._M_head_impl;
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_188,
                 (long)local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start);
      if (local_1b9 == true) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_188,&local_128);
        iVar2 = (int)local_180;
        _Var4._M_head_impl = local_188._M_head_impl;
      }
      EVP_CIPHER_CTX_cleanup((EVP_CIPHER_CTX *)local_c8);
      EVP_CIPHER_CTX_init((EVP_CIPHER_CTX *)local_c8);
      iVar3 = EVP_DecryptInit_ex((EVP_CIPHER_CTX *)local_c8,cipher,(ENGINE *)0x0,
                                 local_e8.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start,
                                 local_108.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start);
      local_1b8[0] = iVar3 != 0;
      local_1b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (iVar3 == 0) {
        testing::Message::Message((Message *)&local_170);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_1a8,(internal *)local_1b8,
                   (AssertionResult *)
                   "EVP_DecryptInit_ex(ctx.get(), cipher, nullptr, key.data(), iv.data())","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_160,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/xts/xts_test.cc"
                   ,0x105,(char *)local_1a8);
        testing::internal::AssertHelper::operator=(&local_160,(Message *)&local_170);
        goto LAB_00125a86;
      }
      iVar2 = EVP_DecryptUpdate((EVP_CIPHER_CTX *)local_c8,(uchar *)local_188._M_head_impl,
                                &local_158,(uchar *)_Var4._M_head_impl,
                                iVar2 - (int)_Var4._M_head_impl);
      local_1b8[0] = iVar2 != 0;
      local_1b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (iVar2 == 0) {
        testing::Message::Message((Message *)&local_170);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_1a8,(internal *)local_1b8,
                   (AssertionResult *)
                   "EVP_DecryptUpdate(ctx.get(), out.data(), &len, in.data(), in.size())","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_160,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/xts/xts_test.cc"
                   ,0x107,(char *)local_1a8);
        testing::internal::AssertHelper::operator=(&local_160,(Message *)&local_170);
        goto LAB_00125a86;
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_188,(long)local_158
                );
      local_1b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish +
                  -(long)local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_start);
      local_1b8 = (undefined1  [8])
                  local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      local_170.span_.size_ = (long)local_180 - (long)local_188._M_head_impl;
      local_170.span_.data_ = (uchar *)local_188._M_head_impl;
      testing::internal::CmpHelperEQ<Bytes,Bytes>
                ((internal *)local_1a8,"Bytes(plaintext)","Bytes(out)",(Bytes *)local_1b8,&local_170
                );
      if (local_1a8[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_1b8);
        pcVar5 = "";
        if (local_1a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = (local_1a0->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_170,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/xts/xts_test.cc"
                   ,0x109,pcVar5);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_170,(Message *)local_1b8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_170);
        if (local_1b8 != (undefined1  [8])0x0) {
          (**(code **)(*(long *)local_1b8 + 8))();
        }
      }
      if (local_1a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_1a0,local_1a0);
      }
      EVP_CIPHER_CTX_cleanup((EVP_CIPHER_CTX *)local_c8);
      if (local_188._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        operator_delete(local_188._M_head_impl,local_178 - (long)local_188._M_head_impl);
      }
      testing::ScopedTrace::~ScopedTrace(&local_1ba);
      lVar6 = lVar6 + 1;
    } while (lVar6 != 2);
    bVar1 = false;
LAB_00125afa:
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
        local_128.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      operator_delete(local_128.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_128.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_128.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
        local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      operator_delete(local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_148.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_148.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (uchar *)0x0) {
      operator_delete(local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_108.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_108.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (uchar *)0x0) {
      operator_delete(local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_e8.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_e8.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    testing::ScopedTrace::~ScopedTrace(&local_1bb);
    local_150 = local_150 + 0x20;
    if (bVar1 || local_150 == 0xa0) {
      return;
    }
  } while( true );
}

Assistant:

TEST(XTSTest, TestVectors) {
  unsigned test_num = 0;
  for (const auto &test : kXTSTestCases) {
    test_num++;
    SCOPED_TRACE(test_num);

    const EVP_CIPHER *cipher = EVP_aes_256_xts();

    std::vector<uint8_t> key, iv, plaintext, ciphertext;
    ASSERT_TRUE(DecodeHex(&key, test.key_hex));
    ASSERT_TRUE(DecodeHex(&iv, test.iv_hex));
    ASSERT_TRUE(DecodeHex(&plaintext, test.plaintext_hex));
    ASSERT_TRUE(DecodeHex(&ciphertext, test.ciphertext_hex));

    ASSERT_EQ(EVP_CIPHER_key_length(cipher), key.size());
    ASSERT_EQ(EVP_CIPHER_iv_length(cipher), iv.size());
    ASSERT_EQ(plaintext.size(), ciphertext.size());

    // Note XTS doesn't support streaming, so we only test single-shot inputs.
    for (bool in_place : {false, true}) {
      SCOPED_TRACE(in_place);

      // Test encryption.
      bssl::Span<const uint8_t> in = plaintext;
      std::vector<uint8_t> out(plaintext.size());
      if (in_place) {
        out = plaintext;
        in = out;
      }

      bssl::ScopedEVP_CIPHER_CTX ctx;
      ASSERT_TRUE(EVP_EncryptInit_ex(ctx.get(), cipher, nullptr, key.data(),
                                     iv.data()));
      int len;
      ASSERT_TRUE(
          EVP_EncryptUpdate(ctx.get(), out.data(), &len, in.data(), in.size()));
      out.resize(len);
      EXPECT_EQ(Bytes(ciphertext), Bytes(out));

      // Test decryption.
      in = ciphertext;
      out.clear();
      out.resize(plaintext.size());
      if (in_place) {
        out = ciphertext;
        in = out;
      }

      ctx.Reset();
      ASSERT_TRUE(EVP_DecryptInit_ex(ctx.get(), cipher, nullptr, key.data(),
                                     iv.data()));
      ASSERT_TRUE(
          EVP_DecryptUpdate(ctx.get(), out.data(), &len, in.data(), in.size()));
      out.resize(len);
      EXPECT_EQ(Bytes(plaintext), Bytes(out));
    }
  }
}